

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeRecordCompareString(int nKey1,void *pKey1,UnpackedRecord *pPKey2)

{
  char cVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long in_RDX;
  byte *in_RSI;
  int in_EDI;
  long in_FS_OFFSET;
  int szHdr;
  int nStr;
  int nCmp;
  int res;
  u8 *aKey1;
  int in_stack_00000030;
  int serial_type;
  int local_44;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar6;
  int local_10;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = 0xaaaaaaaa;
  uVar3 = (uint)(char)in_RSI[1];
  do {
    if (0xb < (int)uVar3) {
      if ((uVar3 & 1) == 0) {
        local_10 = (int)*(char *)(in_RDX + 0x21);
      }
      else {
        iVar4 = (int)(uVar3 - 0xc) / 2;
        if (in_EDI < (int)((uint)*in_RSI + iVar4)) {
          iVar4 = sqlite3CorruptError(0);
          *(char *)(in_RDX + 0x1f) = (char)iVar4;
          local_10 = 0;
        }
        else {
          local_44 = iVar4;
          if (*(int *)(in_RDX + 0x18) < iVar4) {
            local_44 = *(int *)(in_RDX + 0x18);
          }
          iVar5 = memcmp(in_RSI + (int)(uint)*in_RSI,*(void **)(in_RDX + 0x10),(long)local_44);
          if (iVar5 < 1) {
            if (iVar5 < 0) {
              local_10 = (int)*(char *)(in_RDX + 0x20);
            }
            else if (iVar4 == *(int *)(in_RDX + 0x18)) {
              if (*(ushort *)(in_RDX + 0x1c) < 2) {
                local_10 = (int)*(char *)(in_RDX + 0x1e);
                *(undefined1 *)(in_RDX + 0x22) = 1;
              }
              else {
                local_10 = sqlite3VdbeRecordCompareWithSkip
                                     (in_stack_00000030,pKey1,pPKey2,aKey1._4_4_);
              }
            }
            else {
              if (iVar4 - *(int *)(in_RDX + 0x18) < 1) {
                cVar1 = *(char *)(in_RDX + 0x20);
              }
              else {
                cVar1 = *(char *)(in_RDX + 0x21);
              }
              local_10 = (int)cVar1;
            }
          }
          else {
            local_10 = (int)*(char *)(in_RDX + 0x21);
          }
        }
      }
      goto LAB_001915f7;
    }
  } while (((int)uVar3 < 0) &&
          (sqlite3GetVarint32((uchar *)CONCAT44(uVar6,in_stack_ffffffffffffffc8),
                              (u32 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)),
          0xb < (int)uVar3));
  local_10 = (int)*(char *)(in_RDX + 0x20);
LAB_001915f7:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

static int vdbeRecordCompareString(
  int nKey1, const void *pKey1, /* Left key */
  UnpackedRecord *pPKey2        /* Right key */
){
  const u8 *aKey1 = (const u8*)pKey1;
  int serial_type;
  int res;

  assert( pPKey2->aMem[0].flags & MEM_Str );
  assert( pPKey2->aMem[0].n == pPKey2->n );
  assert( pPKey2->aMem[0].z == pPKey2->u.z );
  vdbeAssertFieldCountWithinLimits(nKey1, pKey1, pPKey2->pKeyInfo);
  serial_type = (signed char)(aKey1[1]);

vrcs_restart:
  if( serial_type<12 ){
    if( serial_type<0 ){
      sqlite3GetVarint32(&aKey1[1], (u32*)&serial_type);
      if( serial_type>=12 ) goto vrcs_restart;
      assert( CORRUPT_DB );
    }
    res = pPKey2->r1;      /* (pKey1/nKey1) is a number or a null */
  }else if( !(serial_type & 0x01) ){
    res = pPKey2->r2;      /* (pKey1/nKey1) is a blob */
  }else{
    int nCmp;
    int nStr;
    int szHdr = aKey1[0];

    nStr = (serial_type-12) / 2;
    if( (szHdr + nStr) > nKey1 ){
      pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
      return 0;    /* Corruption */
    }
    nCmp = MIN( pPKey2->n, nStr );
    res = memcmp(&aKey1[szHdr], pPKey2->u.z, nCmp);

    if( res>0 ){
      res = pPKey2->r2;
    }else if( res<0 ){
      res = pPKey2->r1;
    }else{
      res = nStr - pPKey2->n;
      if( res==0 ){
        if( pPKey2->nField>1 ){
          res = sqlite3VdbeRecordCompareWithSkip(nKey1, pKey1, pPKey2, 1);
        }else{
          res = pPKey2->default_rc;
          pPKey2->eqSeen = 1;
        }
      }else if( res>0 ){
        res = pPKey2->r2;
      }else{
        res = pPKey2->r1;
      }
    }
  }

  assert( vdbeRecordCompareDebug(nKey1, pKey1, pPKey2, res)
       || CORRUPT_DB
       || pPKey2->pKeyInfo->db->mallocFailed
  );
  return res;
}